

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

uint32_t memory_tree_ns::over_lap(v_array<unsigned_int> *array_1,v_array<unsigned_int> *array_2)

{
  uint uVar1;
  uint **ppuVar2;
  size_t sVar3;
  uint *puVar4;
  v_array<unsigned_int> *in_RSI;
  v_array<unsigned_int> *in_RDI;
  bool bVar5;
  uint32_t c2;
  uint32_t c1;
  uint32_t idx2;
  uint32_t idx1;
  uint32_t num_overlap;
  uint local_1c;
  uint local_18;
  uint32_t local_14;
  
  local_14 = 0;
  ppuVar2 = v_array<unsigned_int>::begin(in_RDI);
  puVar4 = *ppuVar2;
  sVar3 = v_array<unsigned_int>::size(in_RDI);
  qsort(puVar4,sVar3,4,compare_label);
  ppuVar2 = v_array<unsigned_int>::begin(in_RSI);
  puVar4 = *ppuVar2;
  sVar3 = v_array<unsigned_int>::size(in_RSI);
  qsort(puVar4,sVar3,4,compare_label);
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    sVar3 = v_array<unsigned_int>::size(in_RDI);
    bVar5 = false;
    if (local_18 < sVar3) {
      sVar3 = v_array<unsigned_int>::size(in_RSI);
      bVar5 = local_1c < sVar3;
    }
    if (!bVar5) break;
    puVar4 = v_array<unsigned_int>::operator[](in_RDI,(ulong)local_18);
    uVar1 = *puVar4;
    puVar4 = v_array<unsigned_int>::operator[](in_RSI,(ulong)local_1c);
    if (uVar1 < *puVar4) {
      local_18 = local_18 + 1;
    }
    else {
      if (uVar1 <= *puVar4) {
        local_14 = local_14 + 1;
        local_18 = local_18 + 1;
      }
      local_1c = local_1c + 1;
    }
  }
  return local_14;
}

Assistant:

inline uint32_t over_lap(v_array<uint32_t>& array_1, v_array<uint32_t>& array_2){
        uint32_t num_overlap = 0;
        
        qsort(array_1.begin(), array_1.size(), sizeof(uint32_t), compare_label);
        qsort(array_2.begin(), array_2.size(), sizeof(uint32_t), compare_label);

        uint32_t idx1 = 0;
        uint32_t idx2 = 0;
        while (idx1 < array_1.size() && idx2 < array_2.size())
        {
            uint32_t c1 = array_1[idx1];
            uint32_t c2 = array_2[idx2];
            if (c1 < c2)
                idx1++;
            else if (c1 > c2)
                idx2++;
            else{
                num_overlap++;
                idx1++;
                idx2++;
            }
        }
        return num_overlap;
    }